

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O0

bool __thiscall
icu_63::number::impl::NumberStringBuilder::containsField(NumberStringBuilder *this,Field field)

{
  Field FVar1;
  int local_20;
  int32_t i;
  Field field_local;
  NumberStringBuilder *this_local;
  
  local_20 = 0;
  while( true ) {
    if (this->fLength <= local_20) {
      return false;
    }
    FVar1 = fieldAt(this,local_20);
    if (field == FVar1) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

bool NumberStringBuilder::containsField(Field field) const {
    for (int32_t i = 0; i < fLength; i++) {
        if (field == fieldAt(i)) {
            return true;
        }
    }
    return false;
}